

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O2

Curl_tree * Curl_splaygetbest(timeval i,Curl_tree *t,Curl_tree **removed)

{
  __suseconds_t _Var1;
  Curl_tree *pCVar2;
  Curl_tree *t_00;
  __time_t _Var3;
  Curl_tree *pCVar4;
  long lVar5;
  
  lVar5 = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    t_00 = (Curl_tree *)0x0;
    pCVar4 = (Curl_tree *)0x0;
    goto LAB_0012df76;
  }
  t_00 = Curl_splay(i,t);
  _Var3 = (t_00->key).tv_sec;
  if ((lVar5 < _Var3) || ((lVar5 <= _Var3 && (i.tv_usec < (t_00->key).tv_usec)))) {
    pCVar4 = t_00;
    if (t_00->smaller != (Curl_tree *)0x0) {
      t_00 = Curl_splay(t_00->smaller->key,t_00);
      _Var3 = (t_00->key).tv_sec;
      goto LAB_0012df24;
    }
  }
  else {
LAB_0012df24:
    pCVar4 = t_00;
    if ((_Var3 <= lVar5) && ((_Var3 < lVar5 || ((t_00->key).tv_usec <= i.tv_usec)))) {
      pCVar4 = t_00->same;
      if (pCVar4 == (Curl_tree *)0x0) {
        if (t_00->smaller == (Curl_tree *)0x0) {
          pCVar4 = t_00->larger;
        }
        else {
          pCVar4 = Curl_splay(i,t_00->smaller);
          pCVar4->larger = t_00->larger;
        }
      }
      else {
        _Var1 = (t_00->key).tv_usec;
        (pCVar4->key).tv_sec = (t_00->key).tv_sec;
        (pCVar4->key).tv_usec = _Var1;
        pCVar2 = t_00->larger;
        pCVar4->smaller = t_00->smaller;
        pCVar4->larger = pCVar2;
      }
      goto LAB_0012df76;
    }
  }
  t_00 = (Curl_tree *)0x0;
LAB_0012df76:
  *removed = t_00;
  return pCVar4;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct timeval i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  t = Curl_splay(i,t);
  if(compare(i, t->key) < 0) {
    /* too big node, try the smaller chain */
    if(t->smaller)
      t=Curl_splay(t->smaller->key, t);
    else {
      /* fail */
      *removed = NULL;
      return t;
    }
  }

  if(compare(i, t->key) >= 0) {               /* found it */
    /* FIRST! Check if there is a list with identical keys */
    x = t->same;
    if(x) {
      /* there is, pick one from the list */

      /* 'x' is the new root node */

      x->key = t->key;
      x->larger = t->larger;
      x->smaller = t->smaller;

      *removed = t;
      return x; /* new root */
    }

    if(t->smaller == NULL) {
      x = t->larger;
    }
    else {
      x = Curl_splay(i, t->smaller);
      x->larger = t->larger;
    }
    *removed = t;

    return x;
  }
  else {
    *removed = NULL; /* no match */
    return t;        /* It wasn't there */
  }
}